

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

char * netaddr_socket_to_string(netaddr_str *dst,netaddr_socket *src)

{
  uint16_t uVar1;
  char *pcVar2;
  char *pcVar3;
  char local_68 [8];
  char scope_buf [16];
  netaddr_str buf;
  netaddr_socket *src_local;
  netaddr_str *dst_local;
  
  if ((src->v4).sin_family == 2) {
    pcVar2 = inet_ntop(2,&(src->v4).sin_addr,scope_buf + 10,0x3e);
    uVar1 = ntohs((src->v4).sin_port);
    snprintf(dst->buf,0x3e,"%s:%d",pcVar2,(ulong)uVar1);
  }
  else if ((src->v4).sin_family == 10) {
    if ((src->v6).sin6_scope_id == 0) {
      pcVar2 = inet_ntop(10,(src->v4).sin_zero,scope_buf + 10,0x3e);
      uVar1 = ntohs((src->v4).sin_port);
      snprintf(dst->buf,0x3e,"[%s]:%d",pcVar2,(ulong)uVar1);
    }
    else {
      pcVar2 = inet_ntop(10,(src->v4).sin_zero,scope_buf + 10,0x3e);
      uVar1 = ntohs((src->v4).sin_port);
      pcVar3 = if_indextoname((src->v6).sin6_scope_id,local_68);
      snprintf(dst->buf,0x3e,"[%s]:%d%%%s",pcVar2,(ulong)uVar1,pcVar3);
    }
  }
  else if ((src->v4).sin_family == 0) {
    strscpy(dst->buf,"-",0x3e);
  }
  else {
    snprintf(dst->buf,0x3e,"\"Unknown socket type: %d\"",(ulong)(src->v4).sin_family);
  }
  return dst->buf;
}

Assistant:

const char *
netaddr_socket_to_string(struct netaddr_str *dst, const union netaddr_socket *src) {
  struct netaddr_str buf;
  static const char NONE[] = "-";

  if (src->std.sa_family == AF_INET) {
    snprintf(dst->buf, sizeof(*dst), "%s:%d", inet_ntop(AF_INET, &src->v4.sin_addr, buf.buf, sizeof(buf)),
      ntohs(src->v4.sin_port));
  }
  else if (src->std.sa_family == AF_INET6) {
    if (src->v6.sin6_scope_id) {
      char scope_buf[IF_NAMESIZE];

      snprintf(dst->buf, sizeof(*dst), "[%s]:%d%%%s", inet_ntop(AF_INET6, &src->v6.sin6_addr, buf.buf, sizeof(buf)),
        ntohs(src->v6.sin6_port), if_indextoname(src->v6.sin6_scope_id, scope_buf));
    }
    else {
      snprintf(dst->buf, sizeof(*dst), "[%s]:%d", inet_ntop(AF_INET6, &src->v6.sin6_addr, buf.buf, sizeof(buf)),
        ntohs(src->v6.sin6_port));
    }
  }
  else if (src->std.sa_family == 0) {
    strscpy(dst->buf, NONE, sizeof(*dst));
  }
  else {
    snprintf(dst->buf, sizeof(*dst), "\"Unknown socket type: %d\"", src->std.sa_family);
  }

  return dst->buf;
}